

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue JS_GetPrototype(JSContext *ctx,JSValue obj)

{
  JSValueUnion JVar1;
  JSRefCountHeader *p;
  ulong uVar2;
  JSValue val;
  JSValue JVar3;
  JSValue JVar4;
  
  val.tag = (JSValueUnion)obj.tag;
  if ((int)obj.tag == -1) {
    if (*(short *)((long)obj.u.ptr + 6) != 0x29) {
      JVar1 = (JSValueUnion)((JSValueUnion *)(*(long *)((long)obj.u.ptr + 0x18) + 0x38))->ptr;
      if ((int *)JVar1.ptr == (int *)0x0) {
        JVar4 = (JSValue)(ZEXT816(2) << 0x40);
        uVar2 = 0;
      }
      else {
        *(int *)JVar1.ptr = *JVar1.ptr + 1;
        uVar2 = (ulong)JVar1.ptr & 0xffffffff00000000;
        JVar4.tag = -1;
        JVar4.u.ptr = JVar1.ptr;
      }
      goto LAB_0011dd2c;
    }
    JVar4 = js_proxy_getPrototypeOf(ctx,obj);
  }
  else {
    val.u.ptr = (void *)val.tag;
    JVar4 = JS_GetPrototypePrimitive(ctx,val);
    if (0xfffffff4 < (uint)JVar4.tag) {
      *(int *)JVar4.u.ptr = *JVar4.u.ptr + 1;
    }
  }
  uVar2 = (ulong)JVar4.u.ptr & 0xffffffff00000000;
LAB_0011dd2c:
  JVar3.tag = JVar4.tag;
  JVar3.u.ptr = (void *)(JVar4.u._0_4_ | uVar2);
  return JVar3;
}

Assistant:

JSValue JS_GetPrototype(JSContext *ctx, JSValueConst obj)
{
    JSValue val;
    if (JS_VALUE_GET_TAG(obj) == JS_TAG_OBJECT) {
        JSObject *p;
        p = JS_VALUE_GET_OBJ(obj);
        if (unlikely(p->class_id == JS_CLASS_PROXY)) {
            val = js_proxy_getPrototypeOf(ctx, obj);
        } else {
            p = p->shape->proto;
            if (!p)
                val = JS_NULL;
            else
                val = JS_DupValue(ctx, JS_MKPTR(JS_TAG_OBJECT, p));
        }
    } else {
        val = JS_DupValue(ctx, JS_GetPrototypePrimitive(ctx, obj));
    }
    return val;
}